

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedTest.cpp
# Opt level: O1

double CalcMean(vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  undefined1 in_ZMM1 [64];
  
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  uVar3 = (uint)lVar4;
  if ((int)uVar3 < 1) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    uVar5 = 0;
    do {
      dVar6 = dVar6 + pdVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,lVar4);
  return dVar6 / auVar2._0_8_;
}

Assistant:

double CalcMean ( std::vector<double> & v )
{
  double mean = 0;
  
  for(int i = 0; i < (int)v.size(); i++)
  {
    mean += v[i];
  }
  
  mean /= double(v.size());
  
  return mean;
}